

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O1

vector<cfd::js::api::ElementsDestroyAmountStruct,_std::allocator<cfd::js::api::ElementsDestroyAmountStruct>_>
* __thiscall
cfd::core::
JsonObjectVector<cfd::js::api::json::ElementsDestroyAmount,_cfd::js::api::ElementsDestroyAmountStruct>
::ConvertToStruct(vector<cfd::js::api::ElementsDestroyAmountStruct,_std::allocator<cfd::js::api::ElementsDestroyAmountStruct>_>
                  *__return_storage_ptr__,
                 JsonObjectVector<cfd::js::api::json::ElementsDestroyAmount,_cfd::js::api::ElementsDestroyAmountStruct>
                 *this)

{
  pointer pEVar1;
  pointer this_00;
  ElementsDestroyAmountStruct data;
  ElementsDestroyAmountStruct EStack_a8;
  
  (__return_storage_ptr__->
  super__Vector_base<cfd::js::api::ElementsDestroyAmountStruct,_std::allocator<cfd::js::api::ElementsDestroyAmountStruct>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::js::api::ElementsDestroyAmountStruct,_std::allocator<cfd::js::api::ElementsDestroyAmountStruct>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::js::api::ElementsDestroyAmountStruct,_std::allocator<cfd::js::api::ElementsDestroyAmountStruct>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_JsonVector<cfd::js::api::json::ElementsDestroyAmount>).
            super_vector<cfd::js::api::json::ElementsDestroyAmount,_std::allocator<cfd::js::api::json::ElementsDestroyAmount>_>
            .
            super__Vector_base<cfd::js::api::json::ElementsDestroyAmount,_std::allocator<cfd::js::api::json::ElementsDestroyAmount>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (this->super_JsonVector<cfd::js::api::json::ElementsDestroyAmount>).
           super_vector<cfd::js::api::json::ElementsDestroyAmount,_std::allocator<cfd::js::api::json::ElementsDestroyAmount>_>
           .
           super__Vector_base<cfd::js::api::json::ElementsDestroyAmount,_std::allocator<cfd::js::api::json::ElementsDestroyAmount>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pEVar1) {
    do {
      js::api::json::ElementsDestroyAmount::ConvertToStruct(&EStack_a8,this_00);
      std::
      vector<cfd::js::api::ElementsDestroyAmountStruct,_std::allocator<cfd::js::api::ElementsDestroyAmountStruct>_>
      ::push_back(__return_storage_ptr__,&EStack_a8);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&EStack_a8.ignore_items._M_t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)EStack_a8.direct_nonce._M_dataplus._M_p != &EStack_a8.direct_nonce.field_2) {
        operator_delete(EStack_a8.direct_nonce._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)EStack_a8.asset._M_dataplus._M_p != &EStack_a8.asset.field_2) {
        operator_delete(EStack_a8.asset._M_dataplus._M_p);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pEVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }